

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ic.c
# Opt level: O2

int IDACalcIC(void *ida_mem,int icopt,sunrealtype tout1)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined8 uVar12;
  undefined8 *puVar13;
  char *func;
  int iVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  char *msgfmt;
  int iVar18;
  ulong uVar19;
  double dVar20;
  sunrealtype sVar21;
  double dVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double local_b0;
  double local_98;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar6 = -0x14;
    iVar14 = 0x73;
    ida_mem = (IDAMem)0x0;
LAB_0010f244:
    func = "IDACalcIC";
  }
  else {
    if (*(int *)((long)ida_mem + 0x3d0) == 0) {
      msgfmt = "Attempt to call before IDAMalloc.";
      iVar6 = -0x17;
      iVar14 = 0x7e;
      goto LAB_0010f244;
    }
    iVar6 = IDAInitialSetup((IDAMem)ida_mem);
    if (iVar6 != 0) {
      return -0x16;
    }
    *(undefined4 *)((long)ida_mem + 0x3c0) = 1;
    if (icopt - 3U < 0xfffffffe) {
      func = "IDACalcIC";
      msgfmt = "icopt has an illegal value.";
      iVar6 = -0x16;
      iVar14 = 0x92;
    }
    else {
      *(int *)((long)ida_mem + 0x220) = icopt;
      if ((icopt == 1) && (*(long *)((long)ida_mem + 0x1b0) == 0)) {
        func = "IDACalcIC";
        msgfmt = "id = NULL conflicts with icopt.";
        iVar6 = -0x16;
        iVar14 = 0x9b;
      }
      else {
        dVar26 = ABS(tout1 - *(double *)((long)ida_mem + 0x2a8));
        if ((ABS(tout1) + ABS(*(double *)((long)ida_mem + 0x2a8))) *
            (*(double *)((long)ida_mem + 8) + *(double *)((long)ida_mem + 8)) <= dVar26) {
          uVar12 = N_VClone(*(undefined8 *)((long)ida_mem + 0x1c8));
          *(undefined8 *)((long)ida_mem + 0x210) = uVar12;
          uVar12 = N_VClone(*(undefined8 *)((long)ida_mem + 0x1c8));
          *(undefined8 *)((long)ida_mem + 0x218) = uVar12;
          *(undefined8 *)((long)ida_mem + 0x208) = *(undefined8 *)((long)ida_mem + 0x2a8);
          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x60),
                   *(undefined8 *)((long)ida_mem + 0x210));
          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x68),
                   *(undefined8 *)((long)ida_mem + 0x218));
          *(undefined4 *)((long)ida_mem + 0x238) = 1;
          *(double *)((long)ida_mem + 0x250) = dVar26;
          if (icopt == 1) {
            dVar20 = (double)N_VMin(*(undefined8 *)((long)ida_mem + 0x1b0));
            if (dVar20 < 0.0) {
              func = "IDACalcIC";
              msgfmt = "id has illegal values.";
              iVar6 = -0x16;
              iVar14 = 0xbd;
              goto LAB_0010f247;
            }
            if (0.5 < dVar20) {
              *(undefined4 *)((long)ida_mem + 0x238) = 0;
            }
          }
          *(undefined8 *)((long)ida_mem + 0x2e8) = *(undefined8 *)((long)ida_mem + 0x240);
          *(undefined8 *)((long)ida_mem + 0x2d0) = 0x3ff0000000000000;
          *(undefined4 *)((long)ida_mem + 0x234) = 0;
          sVar21 = IDAWrmsNorm((IDAMem)ida_mem,*(N_Vector *)((long)ida_mem + 0x218),
                               *(N_Vector *)((long)ida_mem + 0x180),*(int *)((long)ida_mem + 0x5c));
          uVar19 = -(ulong)(0.5 / (dVar26 * 0.001) < sVar21);
          uVar23 = ~uVar19 & (ulong)(dVar26 * 0.001) | (ulong)(0.5 / sVar21) & uVar19;
          uVar19 = -(ulong)(tout1 < *(double *)((long)ida_mem + 0x2a8));
          local_98 = (double)(uVar19 & (uVar23 ^ 0x8000000000000000) | ~uVar19 & uVar23);
          *(double *)((long)ida_mem + 0x290) = local_98;
          iVar14 = 1;
          dVar26 = 0.0;
          if (icopt == 1) {
            dVar26 = 1.0 / local_98;
            iVar14 = *(int *)((long)ida_mem + 0x228);
          }
          *(double *)((long)ida_mem + 0x2b8) = dVar26;
          iVar7 = 0;
          if (0 < iVar14) {
            iVar7 = iVar14;
          }
          for (iVar11 = 1; iVar6 = 0, iVar11 != 3; iVar11 = iVar11 + 1) {
            iVar6 = 0;
            for (iVar18 = 1; iVar18 != iVar7 + 1; iVar18 = iVar18 + 1) {
              uVar12 = *(undefined8 *)((long)ida_mem + 0x1c8);
              uVar2 = *(undefined8 *)((long)ida_mem + 0x1d8);
              uVar3 = *(undefined8 *)((long)ida_mem + 0x70);
              iVar8 = (**(code **)((long)ida_mem + 0x10))
                                (*(undefined8 *)((long)ida_mem + 0x208),
                                 *(undefined8 *)((long)ida_mem + 0x210),
                                 *(undefined8 *)((long)ida_mem + 0x218),
                                 *(undefined8 *)((long)ida_mem + 0x1a8),
                                 *(undefined8 *)((long)ida_mem + 0x18));
              *(long *)((long)ida_mem + 0x368) = *(long *)((long)ida_mem + 0x368) + 1;
              iVar6 = -8;
              if ((-1 < iVar8) && (iVar6 = -0xc, iVar8 == 0)) {
                N_VScale(*(undefined8 *)((long)ida_mem + 0x1a8),
                         *(undefined8 *)((long)ida_mem + 0x1c0));
                iVar6 = 0;
                bVar5 = true;
                for (iVar8 = 1; iVar8 <= *(int *)((long)ida_mem + 0x22c); iVar8 = iVar8 + 1) {
                  if (*(code **)((long)ida_mem + 0x3f8) != (code *)0x0) {
                    *(long *)((long)ida_mem + 0x390) = *(long *)((long)ida_mem + 0x390) + 1;
                    iVar6 = (**(code **)((long)ida_mem + 0x3f8))
                                      (ida_mem,*(undefined8 *)((long)ida_mem + 0x210),
                                       *(undefined8 *)((long)ida_mem + 0x218),
                                       *(undefined8 *)((long)ida_mem + 0x1a8),uVar12,uVar2,uVar3);
                    if (iVar6 < 0) {
                      iVar6 = -6;
                    }
                    else {
                      if (iVar6 == 0) goto LAB_0010f63a;
LAB_0010fc19:
                      iVar6 = 1;
                    }
                    goto LAB_0010fc35;
                  }
LAB_0010f63a:
                  *(undefined8 *)((long)ida_mem + 0x1f8) = *(undefined8 *)((long)ida_mem + 0x70);
                  iVar6 = (**(code **)((long)ida_mem + 0x400))
                                    (ida_mem,*(undefined8 *)((long)ida_mem + 0x1a8),
                                     *(undefined8 *)((long)ida_mem + 0x180),
                                     *(undefined8 *)((long)ida_mem + 0x210),
                                     *(undefined8 *)((long)ida_mem + 0x218),
                                     *(undefined8 *)((long)ida_mem + 0x1c0));
                  if (iVar6 < 0) {
LAB_0010fc1d:
                    iVar6 = -7;
                    goto LAB_0010fc35;
                  }
                  if (iVar6 != 0) goto LAB_0010fc19;
                  sVar21 = IDAWrmsNorm((IDAMem)ida_mem,*(N_Vector *)((long)ida_mem + 0x1a8),
                                       *(N_Vector *)((long)ida_mem + 0x180),0);
                  if (*(int *)((long)ida_mem + 0x238) == 0) {
                    sVar21 = sVar21 * ABS(*(double *)((long)ida_mem + 0x2b8)) *
                                      *(double *)((long)ida_mem + 0x250);
                  }
                  if (sVar21 <= *(double *)((long)ida_mem + 0x2e8)) goto LAB_0010fce6;
                  dVar26 = 0.0;
                  local_b0 = sVar21;
                  for (iVar6 = 0; iVar6 < *(int *)((long)ida_mem + 0x230); iVar6 = iVar6 + 1) {
                    *(long *)((long)ida_mem + 0x380) = *(long *)((long)ida_mem + 0x380) + 1;
                    uVar4 = *(undefined8 *)((long)ida_mem + 0x1c8);
                    *(undefined8 *)((long)ida_mem + 0x200) = *(undefined8 *)((long)ida_mem + 0x78);
                    uVar15 = *(undefined8 *)((long)ida_mem + 0x1d8);
                    *(undefined8 *)((long)ida_mem + 0x1e8) = uVar15;
                    *(undefined8 *)((long)ida_mem + 0x1f0) = uVar4;
                    dVar24 = local_b0 * local_b0 * 0.5;
                    dVar20 = 1.0;
                    dVar26 = local_b0;
                    if (*(int *)((long)ida_mem + 0x58) != 0) {
                      uVar16 = *(undefined8 *)((long)ida_mem + 0x1a8);
                      if (*(int *)((long)ida_mem + 0x220) == 1) {
                        N_VProd(*(undefined8 *)((long)ida_mem + 0x1b0),uVar16);
                        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,
                                     *(undefined8 *)((long)ida_mem + 0x1a8),
                                     *(undefined8 *)((long)ida_mem + 0x200));
                        uVar17 = *(undefined8 *)((long)ida_mem + 0x210);
                        uVar15 = *(undefined8 *)((long)ida_mem + 0x1e8);
                        uVar16 = *(undefined8 *)((long)ida_mem + 0x200);
                      }
                      else {
                        uVar17 = *(undefined8 *)((long)ida_mem + 0x210);
                      }
                      N_VLinearSum(0x3ff0000000000000,uVar17,uVar16,uVar15);
                      iVar9 = N_VConstrMask(*(undefined8 *)((long)ida_mem + 0x1b8),
                                            *(undefined8 *)((long)ida_mem + 0x1e8),uVar4);
                      dVar20 = 1.0;
                      if (iVar9 == 0) {
                        N_VProd(uVar4,*(undefined8 *)((long)ida_mem + 0x1a8),
                                *(undefined8 *)((long)ida_mem + 0x200));
                        dVar20 = (double)N_VMinQuotient(*(undefined8 *)((long)ida_mem + 0x210),
                                                        *(undefined8 *)((long)ida_mem + 0x200));
                        dVar20 = dVar20 * 0.99;
                        dVar26 = local_b0 * dVar20;
                        if (dVar26 <= *(double *)((long)ida_mem + 0x248)) {
                          iVar6 = 2;
                          goto LAB_0010fc35;
                        }
                        uVar4 = *(undefined8 *)((long)ida_mem + 0x1a8);
                        N_VScale(uVar4,uVar4);
                      }
                    }
                    dVar1 = *(double *)((long)ida_mem + 0x248);
                    if (*(int *)((long)ida_mem + 0x220) == 2) {
                      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x218),
                               *(undefined8 *)((long)ida_mem + 0x1f0));
                    }
                    iVar9 = 0;
                    dVar25 = 1.0;
                    while( true ) {
                      if (iVar9 == *(int *)((long)ida_mem + 0x23c)) {
                        iVar6 = 3;
                        goto LAB_0010fc35;
                      }
                      puVar13 = (undefined8 *)((long)ida_mem + 0x1a8);
                      if (*(int *)((long)ida_mem + 0x220) == 1) {
                        N_VProd(*(undefined8 *)((long)ida_mem + 0x1b0),
                                *(undefined8 *)((long)ida_mem + 0x1a8),
                                *(undefined8 *)((long)ida_mem + 0x200));
                        N_VLinearSum(0x3ff0000000000000,-*(double *)((long)ida_mem + 0x2b8) * dVar25
                                     ,*(undefined8 *)((long)ida_mem + 0x218),
                                     *(undefined8 *)((long)ida_mem + 0x200),
                                     *(undefined8 *)((long)ida_mem + 0x1f0));
                        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,
                                     *(undefined8 *)((long)ida_mem + 0x1a8),
                                     *(undefined8 *)((long)ida_mem + 0x200));
                        puVar13 = (undefined8 *)((long)ida_mem + 0x200);
                      }
                      N_VLinearSum(0x3ff0000000000000,-dVar25,*(undefined8 *)((long)ida_mem + 0x210)
                                   ,*puVar13,*(undefined8 *)((long)ida_mem + 0x1e8));
                      iVar10 = (**(code **)((long)ida_mem + 0x10))
                                         (*(undefined8 *)((long)ida_mem + 0x208),
                                          *(undefined8 *)((long)ida_mem + 0x1e8),
                                          *(undefined8 *)((long)ida_mem + 0x1f0),
                                          *(undefined8 *)((long)ida_mem + 0x1f8),
                                          *(undefined8 *)((long)ida_mem + 0x18));
                      *(long *)((long)ida_mem + 0x368) = *(long *)((long)ida_mem + 0x368) + 1;
                      if (iVar10 < 0) {
                        iVar6 = -8;
                        goto LAB_0010fc35;
                      }
                      if (iVar10 != 0) goto LAB_0010fc19;
                      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x1f8),
                               *(undefined8 *)((long)ida_mem + 0x1c0));
                      iVar10 = (**(code **)((long)ida_mem + 0x400))
                                         (ida_mem,*(undefined8 *)((long)ida_mem + 0x1f8),
                                          *(undefined8 *)((long)ida_mem + 0x180),
                                          *(undefined8 *)((long)ida_mem + 0x1e8),
                                          *(undefined8 *)((long)ida_mem + 0x1f0),
                                          *(undefined8 *)((long)ida_mem + 0x1c0));
                      if (iVar10 < 0) goto LAB_0010fc1d;
                      if (iVar10 != 0) goto LAB_0010fc19;
                      dVar22 = IDAWrmsNorm((IDAMem)ida_mem,*(N_Vector *)((long)ida_mem + 0x1f8),
                                           *(N_Vector *)((long)ida_mem + 0x180),0);
                      if (*(int *)((long)ida_mem + 0x238) == 0) {
                        dVar22 = dVar22 * ABS(*(double *)((long)ida_mem + 0x2b8)) *
                                          *(double *)((long)ida_mem + 0x250);
                      }
                      if ((*(int *)((long)ida_mem + 0x224) != 0) ||
                         (dVar22 * dVar22 * 0.5 <= dVar24 * -2.0 * dVar20 * 0.0001 * dVar25 + dVar24
                         )) break;
                      if (dVar25 < dVar1 / dVar26) {
                        iVar6 = 3;
                        goto LAB_0010fc35;
                      }
                      dVar25 = dVar25 * 0.5;
                      *(int *)((long)ida_mem + 0x234) = *(int *)((long)ida_mem + 0x234) + 1;
                      iVar9 = iVar9 + 1;
                    }
                    N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x1e8),
                             *(undefined8 *)((long)ida_mem + 0x210));
                    if (*(int *)((long)ida_mem + 0x220) == 1) {
                      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x1f0),
                               *(undefined8 *)((long)ida_mem + 0x218));
                    }
                    if (dVar22 <= *(double *)((long)ida_mem + 0x2e8)) goto LAB_0010fce6;
                    dVar26 = dVar22 / local_b0;
                    N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x1f8),
                             *(undefined8 *)((long)ida_mem + 0x1a8));
                    local_b0 = dVar22;
                  }
                  if ((0.9 < dVar26) && (sVar21 * 0.1 <= local_b0)) {
                    iVar6 = 4;
                    goto LAB_0010fc35;
                  }
                  if (*(long *)((long)ida_mem + 0x3f8) == 0) {
                    iVar6 = 5;
                    goto LAB_0010fc35;
                  }
                  N_VScale(*(undefined8 *)((long)ida_mem + 0x1c0),
                           *(undefined8 *)((long)ida_mem + 0x1a8));
                  bVar5 = false;
                  iVar6 = 5;
                }
                if (bVar5) goto LAB_0010fce6;
              }
LAB_0010fc35:
              *(long *)((long)ida_mem + 0x370) = *(long *)((long)ida_mem + 0x370) + 1;
              if ((iVar6 < 0) || (iVar18 == iVar14)) goto LAB_0010fd47;
              if (iVar6 != 5) {
                N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x60),
                         *(undefined8 *)((long)ida_mem + 0x210));
                N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x68),
                         *(undefined8 *)((long)ida_mem + 0x218));
              }
              local_98 = local_98 * 0.1;
              *(double *)((long)ida_mem + 0x2b8) = 1.0 / local_98;
              *(double *)((long)ida_mem + 0x290) = local_98;
            }
            if (iVar6 != 0) break;
LAB_0010fce6:
            iVar6 = (**(code **)((long)ida_mem + 0x48))
                              (*(undefined8 *)((long)ida_mem + 0x210),
                               *(undefined8 *)((long)ida_mem + 0x180),
                               *(undefined8 *)((long)ida_mem + 0x50));
            if (iVar6 != 0) {
              iVar6 = -0x18;
              break;
            }
            N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x210),
                     *(undefined8 *)((long)ida_mem + 0x60));
            N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x218),
                     *(undefined8 *)((long)ida_mem + 0x68));
          }
LAB_0010fd47:
          N_VDestroy(*(undefined8 *)((long)ida_mem + 0x210));
          N_VDestroy(*(undefined8 *)((long)ida_mem + 0x218));
          if (icopt == 1) {
            *(double *)((long)ida_mem + 0x298) = local_98;
          }
          switch(iVar6) {
          case 0:
            goto switchD_0010fd8a_caseD_0;
          case 1:
            func = "IDAICFailFlag";
            msgfmt = 
            "The residual routine or the linear setup or solve routine had a recoverable error, but IDACalcIC was unable to recover."
            ;
            iVar6 = -0xe;
            iVar14 = 0x2c1;
            break;
          case 2:
            func = "IDAICFailFlag";
            msgfmt = "Unable to satisfy the inequality constraints.";
            iVar6 = -0xb;
            iVar14 = 0x2c6;
            break;
          case 3:
            func = "IDAICFailFlag";
            msgfmt = "The linesearch algorithm failed: step too small or too many backtracks.";
            iVar6 = -0xd;
            iVar14 = 0x2cb;
            break;
          case 4:
            func = "IDAICFailFlag";
            msgfmt = "Newton/Linesearch algorithm failed to converge.";
            iVar6 = -4;
            iVar14 = 0x2d0;
            break;
          case 5:
            func = "IDAICFailFlag";
            msgfmt = "Newton/Linesearch algorithm failed to converge.";
            iVar6 = -4;
            iVar14 = 0x2d5;
            break;
          case -0xc:
            func = "IDAICFailFlag";
            msgfmt = "The residual function failed at the first call. ";
            iVar6 = -0xc;
            iVar14 = 0x2b2;
            break;
          case -0xb:
          case -10:
          case -9:
          case -5:
          case -4:
          case -3:
          case -2:
          case -1:
            return -99;
          case -8:
            func = "IDAICFailFlag";
            msgfmt = "The residual function failed unrecoverably. ";
            iVar6 = -8;
            iVar14 = 0x2ad;
            break;
          case -7:
            func = "IDAICFailFlag";
            msgfmt = "The linear solver solve failed unrecoverably.";
            iVar6 = -7;
            iVar14 = 700;
            break;
          case -6:
            func = "IDAICFailFlag";
            msgfmt = "The linear solver setup failed unrecoverably.";
            iVar6 = -6;
            iVar14 = 0x2b7;
            break;
          default:
            if (iVar6 != -0x18) {
              return -99;
            }
            func = "IDAICFailFlag";
            msgfmt = "Some initial ewt component = 0.0 illegal.";
            iVar6 = -0x18;
            iVar14 = 0x2da;
          }
        }
        else {
          func = "IDACalcIC";
          msgfmt = "tout1 too close to t0 to attempt initial condition calculation.";
          iVar6 = -0x16;
          iVar14 = 0xa6;
        }
      }
    }
  }
LAB_0010f247:
  IDAProcessError((IDAMem)ida_mem,iVar6,iVar14,func,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                  ,msgfmt);
switchD_0010fd8a_caseD_0:
  return iVar6;
}

Assistant:

int IDACalcIC(void* ida_mem, int icopt, sunrealtype tout1)
{
  int ewtsetOK;
  int ier, nwt, nh, mxnh, icret, retval = 0;
  sunrealtype tdist, troundoff, minid, hic, ypnorm;
  IDAMem IDA_mem;

  /* Check if IDA memory exists */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if problem was malloc'ed */

  if (IDA_mem->ida_MallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_MALLOC);
  }

  /* Check inputs to IDA for correctness and consistency */

  ier = IDAInitialSetup(IDA_mem);
  if (ier != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  IDA_mem->ida_SetupDone = SUNTRUE;

  /* Check legality of input arguments, and set IDA memory copies. */

  if (icopt != IDA_YA_YDP_INIT && icopt != IDA_Y_INIT)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_BAD_ICOPT);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  IDA_mem->ida_icopt = icopt;

  if (icopt == IDA_YA_YDP_INIT && (IDA_mem->ida_id == NULL))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_MISSING_ID);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  tdist     = SUNRabs(tout1 - IDA_mem->ida_tn);
  troundoff = TWO * IDA_mem->ida_uround *
              (SUNRabs(IDA_mem->ida_tn) + SUNRabs(tout1));
  if (tdist < troundoff)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_TOO_CLOSE);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Allocate space and initialize temporary vectors */

  IDA_mem->ida_yy0 = N_VClone(IDA_mem->ida_ee);
  IDA_mem->ida_yp0 = N_VClone(IDA_mem->ida_ee);
  IDA_mem->ida_t0  = IDA_mem->ida_tn;
  N_VScale(ONE, IDA_mem->ida_phi[0], IDA_mem->ida_yy0);
  N_VScale(ONE, IDA_mem->ida_phi[1], IDA_mem->ida_yp0);

  /* For use in the IDA_YA_YP_INIT case, set sysindex and tscale. */

  IDA_mem->ida_sysindex = 1;
  IDA_mem->ida_tscale   = tdist;
  if (icopt == IDA_YA_YDP_INIT)
  {
    minid = N_VMin(IDA_mem->ida_id);
    if (minid < ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_IC_BAD_ID);
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (IDA_ILL_INPUT);
    }
    if (minid > HALF) { IDA_mem->ida_sysindex = 0; }
  }

  /* Set the test constant in the Newton convergence test */

  IDA_mem->ida_epsNewt = IDA_mem->ida_epiccon;

  /* Initializations:
     cjratio = 1 (for use in direct linear solvers);
     set nbacktr = 0; */

  IDA_mem->ida_cjratio = ONE;
  IDA_mem->ida_nbacktr = 0;

  /* Set hic, hh, cj, and mxnh. */

  hic    = PT001 * tdist;
  ypnorm = IDAWrmsNorm(IDA_mem, IDA_mem->ida_yp0, IDA_mem->ida_ewt,
                       IDA_mem->ida_suppressalg);
  if (ypnorm > HALF / hic) { hic = HALF / ypnorm; }
  if (tout1 < IDA_mem->ida_tn) { hic = -hic; }
  IDA_mem->ida_hh = hic;
  if (icopt == IDA_YA_YDP_INIT)
  {
    IDA_mem->ida_cj = ONE / hic;
    mxnh            = IDA_mem->ida_maxnh;
  }
  else
  {
    IDA_mem->ida_cj = ZERO;
    mxnh            = 1;
  }

  /* Loop over nwt = number of evaluations of ewt vector. */

  for (nwt = 1; nwt <= 2; nwt++)
  {
    /* Loop over nh = number of h values. */
    for (nh = 1; nh <= mxnh; nh++)
    {
      /* Call the IC nonlinear solver function. */
      retval = IDAnlsIC(IDA_mem);

      /* Cut h and loop on recoverable IDA_YA_YDP_INIT failure; else break. */
      if (retval == IDA_SUCCESS) { break; }
      IDA_mem->ida_ncfn++;
      if (retval < 0) { break; }
      if (nh == mxnh) { break; }
      /* If looping to try again, reset yy0 and yp0 if not converging. */
      if (retval != IC_SLOW_CONVRG)
      {
        N_VScale(ONE, IDA_mem->ida_phi[0], IDA_mem->ida_yy0);
        N_VScale(ONE, IDA_mem->ida_phi[1], IDA_mem->ida_yp0);
      }
      hic *= PT1;
      IDA_mem->ida_cj = ONE / hic;
      IDA_mem->ida_hh = hic;
    } /* End of nh loop */

    /* Break on failure; else reset ewt, save yy0, yp0 in phi, and loop. */
    if (retval != IDA_SUCCESS) { break; }
    ewtsetOK = IDA_mem->ida_efun(IDA_mem->ida_yy0, IDA_mem->ida_ewt,
                                 IDA_mem->ida_edata);
    if (ewtsetOK != 0)
    {
      retval = IDA_BAD_EWT;
      break;
    }
    N_VScale(ONE, IDA_mem->ida_yy0, IDA_mem->ida_phi[0]);
    N_VScale(ONE, IDA_mem->ida_yp0, IDA_mem->ida_phi[1]);

  } /* End of nwt loop */

  /* Free temporary space */

  N_VDestroy(IDA_mem->ida_yy0);
  N_VDestroy(IDA_mem->ida_yp0);

  /* Load the optional outputs. */

  if (icopt == IDA_YA_YDP_INIT) { IDA_mem->ida_hused = hic; }

  /* On any failure, print message and return proper flag. */

  if (retval != IDA_SUCCESS)
  {
    icret = IDAICFailFlag(IDA_mem, retval);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (icret);
  }

  /* Otherwise return success flag. */

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}